

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles2::Functional::FragCoordXYZCase::iterate(FragCoordXYZCase *this)

{
  RenderContext *pRVar1;
  bool bVar2;
  int i;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  deUint32 err;
  int iVar6;
  undefined4 extraout_var;
  RenderTarget *pRVar7;
  long lVar8;
  TestError *this_00;
  char *description;
  int iVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  Vec3 scaledFC;
  RGBA threshold;
  Surface refImg;
  Surface testImg;
  float positions [16];
  deUint16 indices [6];
  ProgramSources sources;
  ShaderProgram program;
  undefined1 local_2d0 [8];
  char *local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  undefined4 local_2a8;
  float local_29c;
  RGBA local_298;
  RGBA local_294;
  Surface local_290;
  TestLog *local_278;
  Surface local_270;
  undefined8 local_258;
  undefined4 local_250;
  TextureFormat local_248;
  long local_240;
  long local_238 [2];
  undefined1 local_228 [8];
  size_type sStack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e0;
  undefined4 local_1d8;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  undefined1 local_1c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  pointer pbStack_198;
  int local_190;
  pointer local_188;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  ShaderProgram local_100;
  
  local_278 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar7->m_width;
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar7->m_height;
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar9 = (pRVar7->m_pixelFormat).alphaBits;
  bVar11 = 8 - (char)(pRVar7->m_pixelFormat).redBits;
  uVar4 = 0;
  if (0 < iVar9) {
    uVar4 = 0x1000000 << (8U - (char)iVar9 & 0x1f);
  }
  uVar14 = 0x100 << (8U - (char)(pRVar7->m_pixelFormat).greenBits & 0x1f) | 1 << (bVar11 & 0x1f);
  uVar4 = 0x10000 << (8U - (char)(pRVar7->m_pixelFormat).blueBits & 0x1f) | uVar14 | uVar4;
  uVar13 = 1 << (bVar11 & 0x1f) & 0xff;
  if (0xfd < uVar13) {
    uVar13 = 0xfe;
  }
  uVar14 = uVar14 >> 8 & 0xff;
  if (0xfd < uVar14) {
    uVar14 = 0xfe;
  }
  uVar12 = uVar4 >> 0x10 & 0xff;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  uVar4 = uVar4 >> 0x18;
  if (0xfd < uVar4) {
    uVar4 = 0xfe;
  }
  local_294.m_value = uVar4 * 0x1000000 + (uVar12 << 0x10 | uVar14 << 8 | uVar13) + 0x1010101;
  auVar15._0_4_ = (float)iVar3;
  auVar15._4_4_ = (float)iVar6;
  auVar15._8_8_ = 0;
  auVar15 = divps(_DAT_01a25cf0,auVar15);
  local_258 = auVar15._0_8_;
  local_250 = 0x3f800000;
  tcu::Surface::Surface(&local_270,iVar3,iVar6);
  tcu::Surface::Surface(&local_290,iVar3,iVar6);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_228 = (undefined1  [8])&local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,
             "attribute highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,"");
  local_2d0 = (undefined1  [8])&local_2c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,
             "uniform mediump vec3 u_scale;\nvoid main (void)\n{\n\tgl_FragColor = vec4(gl_FragCoord.xyz*u_scale, 1.0);\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d0,0,0xac);
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = 0;
  local_120._9_7_ = 0;
  local_120[0x10] = 0;
  local_120._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0,(value_type *)local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8,(value_type *)local_2d0);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar1,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  if (local_2d0 != (undefined1  [8])&local_2c0) {
    operator_delete((void *)local_2d0,local_2c0._M_allocated_capacity + 1);
  }
  if (local_228 != (undefined1  [8])&local_218) {
    operator_delete((void *)local_228,local_218._M_allocated_capacity + 1);
  }
  glu::operator<<(local_278,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    local_1d0 = (undefined1  [8])local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Compile failed","");
    tcu::TestError::TestError(this_00,(string *)local_1d0);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1f8 = 0xbf8000003f800000;
  uStack_1f0 = 0x3f8000003f800000;
  local_208 = 0x3f8000003f800000;
  uStack_200 = 0x3f80000000000000;
  local_218._M_allocated_capacity = 0xbf800000bf800000;
  local_218._8_8_ = 0x3f80000000000000;
  local_228 = (undefined1  [8])0x3f800000bf800000;
  sStack_220 = 0x3f800000bf800000;
  local_1e0 = 0x2000200010000;
  local_1d8 = 0x30001;
  uVar5 = (**(code **)(lVar8 + 0xb48))(local_100.m_program.m_program,"u_scale");
  local_248 = (TextureFormat)local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"a_position","");
  local_2d0._0_4_ = A;
  local_2c8 = local_2c0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_248,local_240 + (long)local_248);
  local_2a8 = 0;
  local_1d0._0_4_ = local_2d0._0_4_;
  local_1c8._M_p = (pointer)&local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_2c8,local_2c8 + local_2c0._M_allocated_capacity);
  local_1b8.field_2._M_allocated_capacity._0_4_ = local_2a8;
  local_1b8.field_2._8_8_ = 8;
  pbStack_198 = (pointer)0x400000004;
  local_190 = 0;
  local_188 = (pointer)local_228;
  if (local_2c8 != local_2c0._M_local_buf + 8) {
    operator_delete(local_2c8,local_2c0._8_8_ + 1);
  }
  if (local_248 != (TextureFormat)local_238) {
    operator_delete((void *)local_248,local_238[0] + 1);
  }
  (**(code **)(lVar8 + 0x1680))(local_100.m_program.m_program);
  (**(code **)(lVar8 + 0x1568))(uVar5,1,&local_258);
  local_2d0._0_4_ = R;
  local_2d0._4_4_ = UNORM_INT32;
  local_2c8 = (char *)CONCAT44(local_2c8._4_4_,1);
  local_2c0._M_allocated_capacity = (size_type)&local_1e0;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
            (VertexArrayBinding *)local_1d0,(PrimitiveList *)local_2d0,(DrawUtilCallback *)0x0);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_248.order = RGBA;
  local_248.type = UNORM_INT8;
  if ((void *)local_270.m_pixels.m_cap != (void *)0x0) {
    local_270.m_pixels.m_cap = (size_t)local_270.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_2d0,&local_248,local_270.m_width,local_270.m_height,1,
             (void *)local_270.m_pixels.m_cap);
  glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_2d0);
  err = (**(code **)(lVar8 + 0x800))();
  glu::checkError(err,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderBuiltinVarTests.cpp"
                  ,0x147);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._M_p !=
      &local_1b8) {
    operator_delete(local_1c8._M_p,(ulong)(local_1b8._M_dataplus._M_p + 1));
  }
  if (0 < local_290.m_height) {
    uVar4 = 0;
    iVar3 = local_290.m_height;
    iVar6 = local_290.m_width;
    do {
      if (0 < iVar6) {
        local_29c = (float)(int)uVar4 + 0.5;
        iVar9 = 0;
        do {
          local_228._4_4_ = local_29c;
          local_228._0_4_ = (float)iVar9 + 0.5;
          sStack_220 = CONCAT44(sStack_220._4_4_,
                                (((float)(int)(local_290.m_height + ~uVar4) + 0.5) /
                                 (float)local_290.m_height + ((float)iVar9 + 0.5) / (float)iVar6) *
                                0.5);
          local_2c8 = (char *)((ulong)local_2c8 & 0xffffffff00000000);
          local_2d0._0_4_ = R;
          local_2d0._4_4_ = SNORM_INT8;
          lVar8 = 0;
          do {
            *(float *)(local_2d0 + lVar8 * 4) =
                 *(float *)(local_228 + lVar8 * 4) * *(float *)((long)&local_258 + lVar8 * 4);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          local_1d0 = local_2d0;
          local_1c8._M_p._4_4_ = 0x3f800000;
          local_1c8._M_p._0_4_ = (int)local_2c8;
          tcu::RGBA::RGBA(&local_298,(Vec4 *)local_1d0);
          *(deUint32 *)
           ((long)local_290.m_pixels.m_ptr + (long)(int)(local_290.m_width * uVar4 + iVar9) * 4) =
               local_298.m_value;
          iVar9 = iVar9 + 1;
          iVar3 = local_290.m_height;
          iVar6 = local_290.m_width;
        } while (iVar9 < local_290.m_width);
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < iVar3);
  }
  bVar2 = tcu::pixelThresholdCompare
                    (local_278,"Result","Image comparison result",&local_290,&local_270,&local_294,
                     COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,description
            );
  glu::ShaderProgram::~ShaderProgram(&local_100);
  tcu::Surface::~Surface(&local_290);
  tcu::Surface::~Surface(&local_270);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= m_context.getRenderTarget().getWidth();
		const int				height		= m_context.getRenderTarget().getHeight();
		const tcu::RGBA			threshold	= tcu::RGBA(1,1,1,1) + m_context.getRenderTarget().getPixelFormat().getColorThreshold();
		const tcu::Vec3			scale		(1.f / float(width), 1.f / float(height), 1.0f);

		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"attribute highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			"uniform mediump vec3 u_scale;\n"
			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(gl_FragCoord.xyz*u_scale, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			const float positions[] =
			{
				-1.0f,  1.0f, -1.0f, 1.0f,
				-1.0f, -1.0f,  0.0f, 1.0f,
				 1.0f,  1.0f,  0.0f, 1.0f,
				 1.0f, -1.0f,  1.0f, 1.0f
			};
			const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

			const int				scaleLoc	= gl.getUniformLocation(program.getProgram(), "u_scale");
			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_position", 4, 4, 0, &positions[0]);

			gl.useProgram(program.getProgram());
			gl.uniform3fv(scaleLoc, 1, scale.getPtr());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));

			glu::readPixels(m_context.getRenderContext(), 0, 0, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		for (int y = 0; y < refImg.getHeight(); y++)
		{
			for (int x = 0; x < refImg.getWidth(); x++)
			{
				const float			xf			= (float(x)+.5f) / float(refImg.getWidth());
				const float			yf			= (float(refImg.getHeight()-y-1)+.5f) / float(refImg.getHeight());
				const float			z			= (xf + yf) / 2.0f;
				const tcu::Vec3		fragCoord	(float(x)+.5f, float(y)+.5f, z);
				const tcu::Vec3		scaledFC	= fragCoord*scale;
				const tcu::Vec4		color		(scaledFC.x(), scaledFC.y(), scaledFC.z(), 1.0f);

				refImg.setPixel(x, y, tcu::RGBA(color));
			}
		}

		// Compare
		{
			bool isOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}